

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateLoad
          (InterfaceVariableScalarReplacement *this,uint32_t type_id,Instruction *ptr,
          Instruction *insert_before)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t res_id;
  Instruction *this_00;
  IRContext *pIVar1;
  pointer inst;
  DefUseManager *this_01;
  Operand *local_d8;
  Instruction *load_inst;
  iterator local_c0;
  undefined8 local_b8;
  SmallVector<unsigned_int,_2UL> local_b0;
  Operand local_88;
  iterator local_58;
  _func_int **local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> load;
  Instruction *insert_before_local;
  Instruction *ptr_local;
  uint32_t type_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  load._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )insert_before;
  this_00 = (Instruction *)operator_new(0x70);
  pIVar1 = Pass::context(&this->super_Pass);
  res_id = Pass::TakeNextId(&this->super_Pass);
  load_inst._4_4_ = Instruction::result_id(ptr);
  local_c0 = (iterator)((long)&load_inst + 4);
  local_b8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_c0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b0,init_list);
  Operand::Operand(&local_88,SPV_OPERAND_TYPE_ID,&local_b0);
  local_58 = &local_88;
  local_50 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator
            ((allocator<spvtools::opt::Operand> *)((long)&load_inst + 3));
  __l._M_len = (size_type)local_50;
  __l._M_array = local_58;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_48,__l,(allocator_type *)((long)&load_inst + 3));
  Instruction::Instruction(this_00,pIVar1,OpLoad,type_id,res_id,&local_48);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_30,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  std::allocator<spvtools::opt::Operand>::~allocator
            ((allocator<spvtools::opt::Operand> *)((long)&load_inst + 3));
  local_d8 = (Operand *)&local_58;
  do {
    local_d8 = local_d8 + -1;
    Operand::~Operand(local_d8);
  } while (local_d8 != &local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b0);
  inst = std::
         unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
         get(&local_30);
  pIVar1 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(pIVar1);
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,inst);
  Instruction::InsertBefore
            ((Instruction *)
             load._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,&local_30);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  return inst;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateLoad(
    uint32_t type_id, Instruction* ptr, Instruction* insert_before) {
  std::unique_ptr<Instruction> load(
      new Instruction(context(), spv::Op::OpLoad, type_id, TakeNextId(),
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_ID, {ptr->result_id()}}}));
  Instruction* load_inst = load.get();
  context()->get_def_use_mgr()->AnalyzeInstDefUse(load_inst);
  insert_before->InsertBefore(std::move(load));
  return load_inst;
}